

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spxid.h
# Opt level: O2

void __thiscall soplex::SPxSteepPR<double>::left4(SPxSteepPR<double> *this,int n,SPxId id)

{
  uint uVar1;
  int iVar2;
  SPxSolverBase<double> *pSVar3;
  pointer pdVar4;
  pointer pdVar5;
  pointer pdVar6;
  UpdateVector<double> *pUVar7;
  double *pdVar8;
  ulong uVar9;
  ulong uVar10;
  double dVar11;
  double dVar12;
  double dVar13;
  double dVar14;
  double dVar15;
  
  if (id.super_DataKey.info != 0) {
    pSVar3 = (this->super_SPxPricer<double>).thesolver;
    pdVar4 = (this->workVec).super_VectorBase<double>.val.
             super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
             _M_start;
    dVar14 = 1.0 / (double)(pSVar3->super_SPxBasisBase<double>).iterCount + 0.1;
    pdVar5 = (pSVar3->coWeights).val.super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_start;
    pdVar6 = (pSVar3->theFvec->thedelta).super_VectorBase<double>.val.
             super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
             _M_start;
    dVar13 = 1.0 / pdVar6[n];
    dVar11 = SSVectorBase<double>::length2(&pSVar3->theCoPvec->thedelta);
    dVar11 = dVar11 * dVar13 * dVar13;
    pUVar7 = ((this->super_SPxPricer<double>).thesolver)->theFvec;
    uVar1 = (pUVar7->thedelta).super_IdxSet.num;
    uVar9 = 0;
    uVar10 = (ulong)uVar1;
    if ((int)uVar1 < 1) {
      uVar10 = uVar9;
    }
    for (; uVar10 != uVar9; uVar9 = uVar9 + 1) {
      iVar2 = (pUVar7->thedelta).super_IdxSet.idx[uVar9];
      dVar12 = pdVar6[iVar2];
      dVar15 = (dVar11 * dVar12 - pdVar4[iVar2] * (dVar13 + dVar13)) * dVar12 + pdVar5[iVar2];
      pdVar5[iVar2] = dVar15;
      dVar12 = dVar14;
      if (dVar15 < dVar14) {
LAB_001ffd2a:
        pdVar5[iVar2] = dVar12;
      }
      else {
        pdVar8 = (double *)infinity();
        if (*pdVar8 <= dVar15) {
          dVar12 = 1.0 / (this->super_SPxPricer<double>).thetolerance;
          goto LAB_001ffd2a;
        }
      }
    }
    pdVar5[n] = dVar11;
  }
  return;
}

Assistant:

inline bool isValid() const
   {
      return info != 0;
   }